

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

u_char * ngx_cpystrn(u_char *dst,u_char *src,size_t n)

{
  u_char uVar1;
  long lVar2;
  
  if (n != 0) {
    for (lVar2 = 0; n - 1 != lVar2; lVar2 = lVar2 + 1) {
      uVar1 = src[lVar2];
      dst[lVar2] = uVar1;
      if (uVar1 == '\0') {
        return dst + lVar2;
      }
    }
    dst[lVar2] = '\0';
    dst = dst + lVar2;
  }
  return dst;
}

Assistant:

u_char *
ngx_cpystrn(u_char *dst, u_char *src, size_t n)
{
    if (n == 0) {
        return dst;
    }

    while (--n) {
        *dst = *src;

        if (*dst == '\0') {
            return dst;
        }

        dst++;
        src++;
    }

    *dst = '\0';

    return dst;
}